

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void cf_event_reset(cf_event_t *self)

{
  pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
  self->event_status = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
  return;
}

Assistant:

void cf_event_reset(cf_event_t* self) {
#if defined(CF_OS_WIN)
    ResetEvent(self->handle);
#else
    pthread_mutex_lock(&self->mutex);
    self->event_status = CF_FALSE;
    pthread_mutex_unlock(&self->mutex);
#endif
}